

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shannon.c
# Opt level: O2

double inform_shannon_entropy(inform_dist *dist,double base)

{
  _Bool _Var1;
  size_t sVar2;
  size_t i;
  size_t sVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  _Var1 = inform_dist_is_valid(dist);
  if (_Var1) {
    sVar2 = inform_dist_size(dist);
    dVar6 = 0.0;
    for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
      if (dist->histogram[sVar3] != 0) {
        dVar4 = (double)dist->histogram[sVar3] /
                (((double)CONCAT44(0x45300000,(int)(dist->counts >> 0x20)) - 1.9342813113834067e+25)
                + ((double)CONCAT44(0x43300000,(int)dist->counts) - 4503599627370496.0));
        dVar5 = log2(dVar4);
        dVar6 = dVar6 - dVar5 * dVar4;
      }
    }
    dVar4 = log2(base);
    dVar6 = dVar6 / dVar4;
  }
  else {
    dVar6 = NAN;
  }
  return dVar6;
}

Assistant:

double inform_shannon_entropy(inform_dist const *dist, double base)
{
    // ensure that the distribution is valid
    if (inform_dist_is_valid(dist))
    {
        // get the size of the distribution's support
        size_t const n = inform_dist_size(dist);
        double h = 0.;
        // for each element of the distribution's support
        for (size_t i = 0; i < n; ++i)
        {
            // the observation_count is non-zero
            if (dist->histogram[i] != 0)
            {
                // get the probability
                double const p = (double) dist->histogram[i] / dist->counts;
                // accumulate the weighted self-information of the event
                h -= p * log2(p);
            }
        }
        // return the entropy
        return h / log2(base);
    }
    // return NaN if the distribution is invalid
    return NAN;
}